

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cc
# Opt level: O2

vec2f __thiscall hmi::renderer::get_coords_from_position(renderer *this,vec2i position)

{
  vec2f vVar1;
  vec2i vVar2;
  float fVar3;
  float fVar4;
  mat3f inverse_transform;
  anon_union_36_10_b4d23817_for_mat<float,_3UL>_2 local_68;
  mat3f local_3c;
  
  vVar2 = get_size(this);
  fVar4 = ((float)position.field_0._0_4_ + (float)position.field_0._0_4_) /
          (float)vVar2.field_0._0_4_ + -1.0;
  fVar3 = 1.0 - ((float)position.field_0._4_4_ + (float)position.field_0._4_4_) /
                (float)vVar2.field_0._4_4_;
  get_view_matrix(&local_3c,this);
  invert<float>((mat<float,_3UL> *)&local_68.xx,&local_3c);
  vVar1.field_0.data[1] =
       local_68.data[1][2] + fVar4 * local_68.data[1][0] + local_68.data[1][1] * fVar3;
  vVar1.field_0.data[0] =
       local_68.data[0][2] + fVar4 * local_68.data[0][0] + local_68.data[0][1] * fVar3;
  return (vec2f)vVar1.field_0;
}

Assistant:

vec2f renderer::get_coords_from_position(vec2i position) {
    vec2f viewport_position = { 0.0f, 0.0f };
    vec2f viewport_size = get_size();

    vec2f normalized;
    normalized.x = 2.0f * (position.x - viewport_position.x) / viewport_size.width - 1;
    normalized.y = 1 - 2.0f * (position.y - viewport_position.y) / viewport_size.height;

    mat3f inverse_transform = invert(get_view_matrix());

    return affine_transform(inverse_transform, normalized);
  }